

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildHandler::RunMakeCommand
          (cmCTestBuildHandler *this,string *command,int *retVal,char *dir,int timeout,ostream *ofs,
          Encoding encoding)

{
  t_BuildProcessingQueueType *this_00;
  t_ErrorsAndWarningsVector *this_01;
  t_BuildProcessingQueueType *queue;
  cmCTest *pcVar1;
  pointer ppcVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  cmsysProcess *cp;
  t_BuildProcessingQueueType *queue_00;
  long lVar7;
  size_t length_00;
  pointer ppcVar8;
  char *pcVar9;
  cmCTestBuildErrorWarning *this_02;
  string *arg;
  cmProcessOutput processOutput;
  size_type tick;
  int length;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string strdata;
  char *data;
  int *local_2e8;
  cmCTestBuildErrorWarning errorwarning;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  LaunchHelper launchHelper;
  ostringstream cmCTestLog_msg;
  undefined4 uStack_204;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [13];
  char *local_90 [4];
  string local_70;
  string local_50;
  
  cmSystemTools::ParseArguments(&args,command);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = 0;
    goto LAB_001547c2;
  }
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&argv,((long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  for (; args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    _cmCTestLog_msg =
         ((args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  }
  _cmCTestLog_msg = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"Run command:");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  local_2e8 = retVal;
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x315,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
               (this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  ppcVar2 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar8 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (ppcVar8 != ppcVar2 && (pcVar9 = *ppcVar8, pcVar9 != (char *)0x0)); ppcVar8 = ppcVar8 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg," \"");
    poVar6 = std::operator<<(poVar6,pcVar9);
    std::operator<<(poVar6,"\"");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x31b,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
                 (this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&errorwarning);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x31e,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
               (this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  LaunchHelper::LaunchHelper(&launchHelper,this);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_SetTimeout(cp,(double)timeout);
  cmsysProcess_Execute(cp);
  tick = 0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"   Each symbol represents ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," bytes of output.");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  pcVar9 = "   \'!\' represents an error and \'*\' a warning.\n";
  if (this->UseCTestLaunch != false) {
    pcVar9 = "";
  }
  poVar6 = std::operator<<(poVar6,pcVar9);
  std::operator<<(poVar6,"    ");
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x33c,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
               (this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  this_00 = &this->BuildProcessingQueue;
  std::deque<char,_std::allocator<char>_>::clear(this_00);
  this->OutputLineCounter = 0;
  this_01 = &this->ErrorsAndWarnings;
  std::
  vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ::clear(this_01);
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->ErrorQuotaReached = false;
  this->WarningQuotaReached = false;
  queue = &this->BuildProcessingErrorQueue;
  while (iVar4 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar4 != 0) {
    for (lVar7 = 0; length_00 = (size_t)length, lVar7 < (long)length_00; lVar7 = lVar7 + 1) {
      if (data[lVar7] == '\0') {
        data[lVar7] = '\n';
      }
    }
    if (iVar4 == 3) {
      cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,1);
      queue_00 = queue;
    }
    else {
      cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,2);
      queue_00 = this_00;
    }
    ProcessBuffer(this,strdata._M_dataplus._M_p,strdata._M_string_length,&tick,0x400,ofs,queue_00);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
  std::__cxx11::string::~string((string *)&local_50);
  piVar3 = local_2e8;
  if (strdata._M_string_length != 0) {
    ProcessBuffer(this,strdata._M_dataplus._M_p,strdata._M_string_length,&tick,0x400,ofs,queue);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
  std::__cxx11::string::~string((string *)&local_70);
  if (strdata._M_string_length != 0) {
    ProcessBuffer(this,strdata._M_dataplus._M_p,strdata._M_string_length,&tick,0x400,ofs,this_00);
  }
  ProcessBuffer(this,(char *)0x0,0,&tick,0x400,ofs,this_00);
  ProcessBuffer(this,(char *)0x0,0,&tick,0x400,ofs,queue);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg," Size of output: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"K");
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x372,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
               (this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar4 = cmsysProcess_GetState(cp);
  switch(iVar4) {
  case 1:
    errorwarning.Text._M_dataplus._M_p = (pointer)&errorwarning.Text.field_2;
    errorwarning.Text._M_string_length = 0;
    errorwarning.Text.field_2._M_local_buf[0] = '\0';
    errorwarning.SourceFile._M_dataplus._M_p = (pointer)&errorwarning.SourceFile.field_2;
    errorwarning.SourceFile._M_string_length = 0;
    errorwarning.SourceFile.field_2._M_local_buf[0] = '\0';
    errorwarning.SourceFileTail._M_dataplus._M_p = (pointer)&errorwarning.SourceFileTail.field_2;
    errorwarning.SourceFileTail._M_string_length = 0;
    errorwarning.SourceFileTail.field_2._M_local_buf[0] = '\0';
    errorwarning.PreContext._M_dataplus._M_p = (pointer)&errorwarning.PreContext.field_2;
    errorwarning.PreContext._M_string_length = 0;
    errorwarning.PreContext.field_2._M_local_buf[0] = '\0';
    errorwarning.PostContext._M_dataplus._M_p = (pointer)&errorwarning.PostContext.field_2;
    errorwarning.PostContext._M_string_length = 0;
    errorwarning.PostContext.field_2._M_local_buf[0] = '\0';
    errorwarning.LogLine = 1;
    std::__cxx11::string::assign((char *)&errorwarning.Text);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)&errorwarning.Text);
    errorwarning.PreContext._M_string_length = 0;
    *errorwarning.PreContext._M_dataplus._M_p = '\0';
    errorwarning.PostContext._M_string_length = 0;
    *errorwarning.PostContext._M_dataplus._M_p = '\0';
    errorwarning.Error = true;
    std::
    vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
    ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>(this_01,&errorwarning);
    this->TotalErrors = this->TotalErrors + 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an error: ");
    pcVar9 = cmsysProcess_GetErrorString(cp);
    poVar6 = std::operator<<(poVar6,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x3a6,local_90[0],false);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    this_02 = &errorwarning;
LAB_00154674:
    cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning(this_02);
    break;
  case 2:
    if (piVar3 != (int *)0x0) {
      iVar5 = cmsysProcess_GetExitException(cp);
      *piVar3 = iVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an exception: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar3);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x394,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
                   (this->super_cmCTestGenericHandler).Quiet);
      goto LAB_00154775;
    }
    break;
  case 4:
    if (piVar3 != (int *)0x0) {
      iVar5 = cmsysProcess_GetExitValue(cp);
      *piVar3 = iVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Command exited with the value: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar3);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x37e,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
                   (this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&errorwarning);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      if (*piVar3 != 0) {
        local_200._M_p = (pointer)&local_1f0;
        local_1f8 = 0;
        local_1f0._M_local_buf[0] = '\0';
        local_1e0._M_p = (pointer)&local_1d0;
        local_1d8 = 0;
        local_1d0._M_local_buf[0] = '\0';
        local_1c0._M_p = (pointer)&local_1b0;
        local_1b8 = 0;
        local_1b0._M_local_buf[0] = '\0';
        local_198._M_p = (pointer)&local_188;
        local_190 = 0;
        local_188._M_local_buf[0] = '\0';
        local_178._M_p = (pointer)local_168;
        local_170 = 0;
        local_168[0]._M_local_buf[0] = '\0';
        _cmCTestLog_msg = (pointer)CONCAT44(1,_cmCTestLog_msg);
        std::__cxx11::string::assign((char *)&local_200);
        std::__cxx11::string::append((char *)&local_200);
        local_190 = 0;
        *local_198._M_p = '\0';
        local_170 = 0;
        *local_178._M_p = '\0';
        _cmCTestLog_msg = (pointer)((ulong)_cmCTestLog_msg & 0xffffffffffffff00);
        std::
        vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>
                  (this_01,(cmCTestBuildErrorWarning *)&cmCTestLog_msg);
        this->TotalWarnings = this->TotalWarnings + 1;
        this_02 = (cmCTestBuildErrorWarning *)&cmCTestLog_msg;
        goto LAB_00154674;
      }
    }
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"There was a timeout");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x398,(char *)CONCAT44(errorwarning.LogLine,errorwarning._0_4_),
                 (this->super_cmCTestGenericHandler).Quiet);
LAB_00154775:
    std::__cxx11::string::~string((string *)&errorwarning);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  LaunchHelper::~LaunchHelper(&launchHelper);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
LAB_001547c2:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar4;
}

Assistant:

int cmCTestBuildHandler::RunMakeCommand(const std::string& command,
                                        int* retVal, const char* dir,
                                        int timeout, std::ostream& ofs,
                                        Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    argv.push_back(arg.c_str());
  }
  argv.push_back(nullptr);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Run command:", this->Quiet);
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " \"" << arg << "\"", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                     this->Quiet);

  // Optionally use make rule launchers to record errors and warnings.
  LaunchHelper launchHelper(this);
  static_cast<void>(launchHelper);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  const std::string::size_type tick_len = 1024;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestOptionalLog(
    this->CTest, HANDLER_PROGRESS_OUTPUT,
    "   Each symbol represents "
      << tick_len << " bytes of output." << std::endl
      << (this->UseCTestLaunch
            ? ""
            : "   '!' represents an error and '*' a warning.\n")
      << "    " << std::flush,
    this->Quiet);

  // Initialize building structures
  this->BuildProcessingQueue.clear();
  this->OutputLineCounter = 0;
  this->ErrorsAndWarnings.clear();
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->WarningQuotaReached = false;
  this->ErrorQuotaReached = false;

  // For every chunk of data
  int res;
  while ((res = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Replace '\0' with '\n', since '\0' does not really make sense. This is
    // for Visual Studio output
    for (int cc = 0; cc < length; ++cc) {
      if (data[cc] == 0) {
        data[cc] = '\n';
      }
    }

    // Process the chunk of data
    if (res == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 1);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingErrorQueue);
    } else {
      processOutput.DecodeText(data, length, strdata, 2);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingQueue);
    }
  }
  processOutput.DecodeText(std::string(), strdata, 1);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingErrorQueue);
  }
  processOutput.DecodeText(std::string(), strdata, 2);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingQueue);
  }

  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingQueue);
  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingErrorQueue);
  cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                     " Size of output: "
                       << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                       << std::endl,
                     this->Quiet);

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Command exited with the value: " << *retVal
                                                           << std::endl,
                         this->Quiet);
      // if a non zero return value
      if (*retVal) {
        // If there was an error running command, report that on the
        // dashboard.
        cmCTestBuildErrorWarning errorwarning;
        errorwarning.LogLine = 1;
        errorwarning.Text =
          "*** WARNING non-zero return value in ctest from: ";
        errorwarning.Text += argv[0];
        errorwarning.PreContext.clear();
        errorwarning.PostContext.clear();
        errorwarning.Error = false;
        this->ErrorsAndWarnings.push_back(std::move(errorwarning));
        this->TotalWarnings++;
      }
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitException(cp);
      cmCTestOptionalLog(this->CTest, WARNING,
                         "There was an exception: " << *retVal << std::endl,
                         this->Quiet);
    }
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "There was a timeout" << std::endl, this->Quiet);
  } else if (result == cmsysProcess_State_Error) {
    // If there was an error running command, report that on the dashboard.
    cmCTestBuildErrorWarning errorwarning;
    errorwarning.LogLine = 1;
    errorwarning.Text = "*** ERROR executing: ";
    errorwarning.Text += cmsysProcess_GetErrorString(cp);
    errorwarning.PreContext.clear();
    errorwarning.PostContext.clear();
    errorwarning.Error = true;
    this->ErrorsAndWarnings.push_back(std::move(errorwarning));
    this->TotalErrors++;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);
  return result;
}